

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O2

void cfl_predict_lbd_ssse3
               (int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3,int width,int height)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  short sVar8;
  undefined4 uVar6;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar7 [16];
  short sVar14;
  short sVar15;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar16 [16];
  short sVar24;
  short sVar25;
  undefined1 auVar26 [16];
  
  auVar2 = pshuflw(ZEXT416((uint)alpha_q3),ZEXT416((uint)alpha_q3),0);
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  auVar3 = pabsw(in_XMM1,auVar2);
  auVar3 = psllw(auVar3,9);
  auVar4 = pshuflw(ZEXT116(*dst),ZEXT116(*dst),0);
  pauVar1 = (undefined1 (*) [16])(pred_buf_q3 + (ulong)(uint)(height << 2) * 8);
  do {
    auVar7 = *(undefined1 (*) [16])pred_buf_q3;
    auVar16 = psignw(auVar2,auVar7);
    auVar7 = pabsw(auVar7,auVar7);
    auVar7 = pmulhrsw(auVar7,auVar3);
    auVar7 = psignw(auVar7,auVar16);
    sVar23 = auVar4._0_2_;
    sVar5 = auVar7._0_2_ + sVar23;
    sVar25 = auVar4._2_2_;
    sVar8 = auVar7._2_2_ + sVar25;
    sVar9 = auVar7._4_2_ + sVar23;
    sVar10 = auVar7._6_2_ + sVar25;
    sVar11 = auVar7._8_2_ + sVar23;
    sVar12 = auVar7._10_2_ + sVar25;
    sVar13 = auVar7._12_2_ + sVar23;
    sVar14 = auVar7._14_2_ + sVar25;
    if (width < 0x10) {
      uVar6 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10),
                       CONCAT12((0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9),
                                CONCAT11((0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 -
                                         (0xff < sVar8),
                                         (0 < sVar5) * (sVar5 < 0x100) * (char)sVar5 -
                                         (0xff < sVar5))));
      if (width == 4) {
        *(undefined4 *)dst = uVar6;
      }
      else {
        *(ulong *)dst =
             CONCAT17((0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14),
                      CONCAT16((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13),
                               CONCAT15((0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 -
                                        (0xff < sVar12),
                                        CONCAT14((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 -
                                                 (0xff < sVar11),uVar6))));
      }
    }
    else {
      auVar7 = *(undefined1 (*) [16])((long)pred_buf_q3 + 0x10);
      auVar16 = psignw(auVar2,auVar7);
      auVar7 = pabsw(auVar7,auVar7);
      auVar7 = pmulhrsw(auVar7,auVar3);
      auVar7 = psignw(auVar7,auVar16);
      sVar15 = auVar7._0_2_ + sVar23;
      sVar17 = auVar7._2_2_ + sVar25;
      sVar18 = auVar7._4_2_ + sVar23;
      sVar19 = auVar7._6_2_ + sVar25;
      sVar20 = auVar7._8_2_ + sVar23;
      sVar21 = auVar7._10_2_ + sVar25;
      sVar22 = auVar7._12_2_ + sVar23;
      sVar24 = auVar7._14_2_ + sVar25;
      *dst = (0 < sVar5) * (sVar5 < 0x100) * (char)sVar5 - (0xff < sVar5);
      dst[1] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
      dst[2] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
      dst[3] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
      dst[4] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
      dst[5] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
      dst[6] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
      dst[7] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
      dst[8] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
      dst[9] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
      dst[10] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
      dst[0xb] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
      dst[0xc] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
      dst[0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
      dst[0xe] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
      dst[0xf] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
      if (width == 0x20) {
        auVar7 = *(undefined1 (*) [16])((long)pred_buf_q3 + 0x20);
        auVar16 = *(undefined1 (*) [16])((long)pred_buf_q3 + 0x30);
        auVar26 = psignw(auVar2,auVar7);
        auVar7 = pabsw(auVar7,auVar7);
        auVar7 = pmulhrsw(auVar7,auVar3);
        auVar7 = psignw(auVar7,auVar26);
        sVar5 = auVar7._0_2_ + sVar23;
        sVar8 = auVar7._2_2_ + sVar25;
        sVar9 = auVar7._4_2_ + sVar23;
        sVar10 = auVar7._6_2_ + sVar25;
        sVar11 = auVar7._8_2_ + sVar23;
        sVar12 = auVar7._10_2_ + sVar25;
        sVar13 = auVar7._12_2_ + sVar23;
        sVar14 = auVar7._14_2_ + sVar25;
        auVar26 = psignw(auVar2,auVar16);
        auVar7 = pabsw(auVar16,auVar16);
        auVar7 = pmulhrsw(auVar7,auVar3);
        auVar7 = psignw(auVar7,auVar26);
        sVar15 = auVar7._0_2_ + sVar23;
        sVar17 = auVar7._2_2_ + sVar25;
        sVar18 = auVar7._4_2_ + sVar23;
        sVar19 = auVar7._6_2_ + sVar25;
        sVar20 = auVar7._8_2_ + sVar23;
        sVar21 = auVar7._10_2_ + sVar25;
        sVar23 = auVar7._12_2_ + sVar23;
        sVar25 = auVar7._14_2_ + sVar25;
        dst[0x10] = (0 < sVar5) * (sVar5 < 0x100) * (char)sVar5 - (0xff < sVar5);
        dst[0x11] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
        dst[0x12] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
        dst[0x13] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
        dst[0x14] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
        dst[0x15] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
        dst[0x16] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
        dst[0x17] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
        dst[0x18] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
        dst[0x19] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
        dst[0x1a] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
        dst[0x1b] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
        dst[0x1c] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
        dst[0x1d] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
        dst[0x1e] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
        dst[0x1f] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
      }
    }
    dst = dst + dst_stride;
    pred_buf_q3 = (int16_t *)((long)pred_buf_q3 + 0x40);
  } while (pred_buf_q3 < pauVar1);
  return;
}

Assistant:

static inline void cfl_predict_lbd_ssse3(const int16_t *pred_buf_q3,
                                         uint8_t *dst, int dst_stride,
                                         int alpha_q3, int width, int height) {
  const __m128i alpha_sign = _mm_set1_epi16(alpha_q3);
  const __m128i alpha_q12 = _mm_slli_epi16(_mm_abs_epi16(alpha_sign), 9);
  const __m128i dc_q0 = _mm_set1_epi16(*dst);
  __m128i *row = (__m128i *)pred_buf_q3;
  const __m128i *row_end = row + height * CFL_BUF_LINE_I128;
  do {
    __m128i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    if (width < 16) {
      res = _mm_packus_epi16(res, res);
      if (width == 4)
        _mm_storeh_epi32((__m128i *)dst, res);
      else
        _mm_storel_epi64((__m128i *)dst, res);
    } else {
      __m128i next = predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      res = _mm_packus_epi16(res, next);
      _mm_storeu_si128((__m128i *)dst, res);
      if (width == 32) {
        res = predict_unclipped(row + 2, alpha_q12, alpha_sign, dc_q0);
        next = predict_unclipped(row + 3, alpha_q12, alpha_sign, dc_q0);
        res = _mm_packus_epi16(res, next);
        _mm_storeu_si128((__m128i *)(dst + 16), res);
      }
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I128) < row_end);
}